

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O2

void __thiscall
helics::apps::PhasorGenerator::setString
          (PhasorGenerator *this,string_view parameter,string_view val)

{
  helics *this_00;
  char *pcVar1;
  double dVar2;
  string_view val_00;
  complex<double> val_01;
  complex<double> valc;
  complex<double> local_38;
  
  pcVar1 = val._M_str;
  this_00 = (helics *)val._M_len;
  val_00._M_str = parameter._M_str;
  val_00._M_len = (size_t)pcVar1;
  helicsGetComplex(this_00,val_00);
  dVar2 = std::abs<double>(&local_38);
  if (1000000000000.0 <= dVar2) {
    SignalGenerator::setString(&this->super_SignalGenerator,(string_view)parameter,(string_view)val)
    ;
  }
  else {
    val_01._M_value._8_8_ = pcVar1;
    val_01._M_value._0_8_ = this_00;
    set(this,parameter,val_01);
  }
  return;
}

Assistant:

void PhasorGenerator::setString(std::string_view parameter, std::string_view val)
    {
        auto valc = helicsGetComplex(val);
        if (std::abs(valc) < 1e12) {
            set(parameter, valc);
        } else {
            SignalGenerator::setString(parameter, val);
        }
    }